

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O1

bool basisu::unpack_bc1_nv(void *pBlock_bits,color_rgba *pPixels,bool set_alpha)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  undefined1 uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48;
  byte local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined4 local_3c;
  
  bVar1 = *(byte *)((long)pBlock_bits + 1);
  uVar4 = *pBlock_bits;
  bVar2 = *(byte *)((long)pBlock_bits + 2);
  bVar3 = *(byte *)((long)pBlock_bits + 3);
  uVar5 = *(ushort *)((long)pBlock_bits + 2);
  uVar8 = *pBlock_bits & 0x1f;
  local_48.m_comps[2] = (uint8_t)((uint)*pBlock_bits * 0x40 + uVar8 * 2 >> 3);
  uVar16 = bVar1 >> 1 & 3 | uVar4 >> 3 & 0xfc;
  local_48.m_comps[1] = (uint8_t)uVar16;
  local_48.m_comps[0] = bVar1 >> 5 | bVar1 & 0xf8;
  uVar12 = (uint)(bVar1 >> 3);
  local_48.m_comps[3] = 0xff;
  local_44 = bVar3 >> 5 | bVar3 & 0xf8;
  uVar17 = (uint)(bVar3 >> 3);
  uVar10 = bVar3 >> 1 & 3 | uVar5 >> 3 & 0xfc;
  uVar14 = bVar2 & 0x1f;
  local_43 = (char)uVar10;
  local_42 = (char)((uint)bVar2 * 0x40 + uVar14 * 2 >> 3);
  local_41 = 0xff;
  iVar15 = uVar10 - uVar16;
  if (uVar5 < uVar4) {
    iVar11 = iVar15 + 3;
    if (-1 < iVar15) {
      iVar11 = iVar15;
    }
    local_40 = (char)((uVar17 + uVar12 * 2) * 0x16 >> 3);
    iVar11 = iVar15 * 0x50 + (iVar11 >> 2);
    iVar15 = uVar16 * 0x100 + 0x80 + iVar11;
    local_3f = (undefined1)(uVar16 * 0x100 + 0x17f + iVar11 >> 8);
    if (-1 < iVar15) {
      local_3f = (undefined1)((uint)iVar15 >> 8);
    }
    local_3e = (char)((uVar14 + uVar8 * 2) * 0x16 >> 3);
    local_3d = 0xff;
    iVar11 = (uVar10 << 8 | 0x80) - iVar11;
    uVar7 = (undefined1)((uint)(iVar11 + 0xff) >> 8);
    if (-1 < iVar11) {
      uVar7 = (undefined1)((uint)iVar11 >> 8);
    }
    local_3c = CONCAT13(0xff,CONCAT12((char)((uVar8 + uVar14 * 2) * 0x16 >> 3),
                                      CONCAT11(uVar7,(char)((uVar12 + uVar17 * 2) * 0x16 >> 3))));
  }
  else {
    local_40 = (char)((uVar17 + uVar12) * 0x21 >> 3);
    iVar11 = iVar15 + 3;
    if (-1 < iVar15) {
      iVar11 = iVar15;
    }
    iVar13 = (iVar11 >> 2) + uVar16 * 0x100;
    iVar11 = iVar15 * 0x80 + iVar13 + 0x80;
    local_3f = (undefined1)((uint)(iVar15 * 0x80 + iVar13 + 0x17f) >> 8);
    if (-1 < iVar11) {
      local_3f = (undefined1)((uint)iVar11 >> 8);
    }
    local_3e = (char)((uVar14 + uVar8) * 0x21 >> 3);
    local_3d = 0xff;
    local_3c = 0;
  }
  if (set_alpha) {
    lVar6 = 0;
    do {
      *pPixels = (color_rgba)(&local_48)[*(byte *)((long)pBlock_bits + lVar6 + 4) & 3];
      (&pPixels->field_0)[1] =
           *(anon_union_4_2_6eba8969_for_color_rgba_0 *)
            ((long)&local_48 + (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) & 0xc));
      (&pPixels->field_0)[2] =
           *(anon_union_4_2_6eba8969_for_color_rgba_0 *)
            ((long)&local_48 + (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) >> 2 & 0xc));
      (&pPixels->field_0)[3] = (&local_48)[*(byte *)((long)pBlock_bits + lVar6 + 4) >> 6];
      lVar6 = lVar6 + 1;
      pPixels = (color_rgba *)(&pPixels->field_0 + 4);
    } while (lVar6 != 4);
  }
  else {
    lVar6 = 0;
    do {
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) & 3);
      (pPixels->field_0).m_comps[0] = local_48.m_comps[uVar9 * 4];
      (pPixels->field_0).m_comps[1] = local_48.m_comps[uVar9 * 4 + 1];
      (pPixels->field_0).m_comps[2] = local_48.m_comps[uVar9 * 4 + 2];
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) & 0xc);
      pPixels[1].field_0.m_comps[0] = local_48.m_comps[uVar9];
      pPixels[1].field_0.m_comps[1] = local_48.m_comps[uVar9 + 1];
      pPixels[1].field_0.m_comps[2] = local_48.m_comps[uVar9 + 2];
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) >> 2 & 0xc);
      pPixels[2].field_0.m_comps[0] = local_48.m_comps[uVar9];
      pPixels[2].field_0.m_comps[1] = local_48.m_comps[uVar9 + 1];
      pPixels[2].field_0.m_comps[2] = local_48.m_comps[uVar9 + 2];
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) >> 6);
      pPixels[3].field_0.m_comps[0] = local_48.m_comps[uVar9 * 4];
      pPixels[3].field_0.m_comps[1] = local_48.m_comps[uVar9 * 4 + 1];
      pPixels[3].field_0.m_comps[2] = local_48.m_comps[uVar9 * 4 + 2];
      lVar6 = lVar6 + 1;
      pPixels = pPixels + 4;
    } while (lVar6 != 4);
  }
  return uVar4 <= uVar5;
}

Assistant:

inline uint32_t get_high_color() const	{ return m_high_color[0] | (m_high_color[1] << 8U); }